

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolStoreString(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  XML_Bool XVar1;
  XML_Char *pXVar2;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  STRING_POOL *pool_local;
  
  pXVar2 = poolAppend(pool,enc,ptr,end);
  if (pXVar2 == (XML_Char *)0x0) {
    pool_local = (STRING_POOL *)0x0;
  }
  else {
    if ((pool->ptr == pool->end) && (XVar1 = poolGrow(pool), XVar1 == '\0')) {
      return (XML_Char *)0x0;
    }
    pXVar2 = pool->ptr;
    pool->ptr = pXVar2 + 1;
    *pXVar2 = '\0';
    pool_local = (STRING_POOL *)pool->start;
  }
  return (XML_Char *)pool_local;
}

Assistant:

static XML_Char *
poolStoreString(STRING_POOL *pool, const ENCODING *enc, const char *ptr,
                const char *end) {
  if (! poolAppend(pool, enc, ptr, end))
    return NULL;
  if (pool->ptr == pool->end && ! poolGrow(pool))
    return NULL;
  *(pool->ptr)++ = 0;
  return pool->start;
}